

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

void __thiscall snmalloc::MessageBuilder<1024UL>::append(MessageBuilder<1024UL> *this,char *ptr)

{
  ulong uVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  
  if (ptr == (char *)0x0) {
    cVar2 = '(';
    lVar3 = 1;
    do {
      uVar1 = this->insert;
      if (uVar1 < 0x3ff) {
        this->insert = uVar1 + 1;
        (this->buffer)._M_elems[uVar1] = cVar2;
      }
      cVar2 = "(nullptr)"[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 10);
  }
  else {
    cVar2 = *ptr;
    if (cVar2 != '\0') {
      pcVar4 = ptr + 1;
      do {
        uVar1 = this->insert;
        if (uVar1 < 0x3ff) {
          this->insert = uVar1 + 1;
          (this->buffer)._M_elems[uVar1] = cVar2;
        }
        cVar2 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar2 != '\0');
    }
  }
  return;
}

Assistant:

void append(const char* ptr)
    {
      if (ptr == nullptr)
      {
        append(nullptr);
        return;
      }

      while (char data = *ptr++)
      {
        append_char(data);
      }
    }